

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GcodePovray.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  double dVar2;
  vector3 cutting_plane_normal;
  vector3 cutting_plane_normal_00;
  string in_file_name_00;
  string in_file_name_01;
  vector3 look_at;
  vector3 cutting_plane_normal_01;
  vector3 massive_center;
  vector3 massive_center_00;
  CuttingPlane cutting_plane;
  undefined1 auVar3 [24];
  char cVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined8 uVar13;
  ostream *poVar14;
  undefined7 uVar15;
  undefined8 uVar16;
  undefined7 uVar18;
  undefined7 uVar19;
  uint uVar20;
  uint uVar21;
  string *psVar22;
  CuttingPlane *in_R8;
  undefined1 uVar23;
  undefined8 in_R9;
  bool has_cutting_plane;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double in_XMM1_Qa;
  double cutting_plane_distance_00;
  undefined1 in_XMM2 [16];
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  double in_XMM5_Qa;
  undefined1 uVar24;
  undefined7 uVar25;
  byte bVar26;
  byte bVar27;
  byte bVar28;
  byte bVar29;
  undefined4 uVar30;
  undefined4 uStack_90c;
  undefined4 local_908;
  undefined4 uStack_904;
  undefined4 local_900;
  int layer_count;
  byte local_8f8;
  undefined7 uStack_8f7;
  double dVar31;
  double layer_before_and_00;
  vector3 *massive_center_01;
  string in_file_name;
  long *local_8b8;
  long local_8b0;
  long local_8a8 [2];
  vector3 local_898;
  undefined8 local_870;
  double local_868;
  double local_860;
  double local_858;
  double local_850;
  double local_848;
  double dStack_840;
  double local_838;
  double dStack_830;
  double local_828;
  double local_820;
  double layer_before_and;
  double layer_only;
  double transparency;
  double cutting_plane_distance;
  double nozzle_width;
  double camera_angle;
  double local_7e8;
  double dStack_7e0;
  double local_7d8;
  double dStack_7d0;
  istringstream ss;
  int local_7b8;
  long local_7b0 [13];
  ios_base local_748 [8];
  ios_base local_740 [264];
  long *local_638 [2];
  long local_628 [2];
  vector3 local_618;
  vector3 local_5f8;
  vector3 local_5d8;
  vector3 local_5b8;
  double local_5a0;
  undefined1 local_598 [16];
  undefined1 local_588 [16];
  undefined1 local_578 [16];
  long *local_568 [2];
  long local_558 [2];
  long *local_548 [2];
  long local_538 [2];
  vector3 local_528;
  vector3 local_508;
  vector3 local_4e8;
  double local_4c8;
  double dStack_4c0;
  double local_4b8;
  vector3 local_4a8;
  vector3 local_488;
  vector3 local_468;
  undefined8 local_450;
  undefined8 local_448;
  double local_440;
  double local_438;
  undefined8 local_430;
  undefined8 uStack_428;
  double local_420;
  undefined8 local_418;
  undefined8 local_410;
  double local_408;
  double local_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  double local_3e8;
  string temp_string;
  ios_base local_360 [264];
  double local_258;
  double dStack_250;
  double local_248;
  fstream configure_file;
  byte abStack_220 [496];
  undefined7 uVar17;
  
  local_5b8.x = -100.0;
  local_5b8.y = -250.0;
  local_5b8.z = 220.0;
  local_5d8.x = -100.0;
  local_5d8.y = 100.0;
  local_5d8.z = 30.0;
  camera_angle = 60.0;
  nozzle_width = 0.4;
  local_5f8.x = 0.177;
  local_5f8.y = 0.472;
  local_5f8.z = 0.59;
  local_618.x = 0.177;
  local_618.y = 0.472;
  local_618.z = 0.59;
  cutting_plane_distance = 0.0;
  transparency = 0.0;
  layer_only = -1.0;
  layer_before_and = -1.0;
  in_file_name._M_dataplus._M_p = (pointer)&in_file_name.field_2;
  in_file_name._M_string_length = 0;
  in_file_name.field_2._M_local_buf[0] = '\0';
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Reading configurations file...\n",0x1f);
  std::fstream::fstream(&configure_file);
  std::fstream::open((char *)&configure_file,0x1097a0);
  if ((abStack_220[*(long *)(_configure_file + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Configurations file not found.\n",0x1f);
    std::operator<<((ostream *)&std::cout,"Exit.\n");
    exit(0);
  }
  temp_string._M_dataplus._M_p = (pointer)&temp_string.field_2;
  temp_string._M_string_length = 0;
  temp_string.field_2._M_local_buf[0] = '\0';
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Parameters derived:\n",0x14);
  local_858 = 60.0;
  local_860 = 0.4;
  local_7e8 = 0.0;
  layer_before_and_00 = -1.0;
  massive_center_01 = (vector3 *)0xbff0000000000000;
  local_868 = 0.0;
  local_850 = 0.0;
  bVar29 = 0;
  uVar19 = 0;
  bVar28 = 0;
  uVar18 = 0;
  bVar27 = 0;
  uVar15 = 0;
  bVar26 = 0;
  uVar17 = 0;
  local_870 = 0;
  uVar21 = 0;
  local_8f8 = 0;
  uStack_8f7 = 0;
  while( true ) {
    uVar23 = (undefined1)in_R9;
    if ((abStack_220[*(long *)(_configure_file + -0x18)] & 2) != 0) break;
    cVar4 = std::ios::widen((char)&stack0xfffffffffffff6c8 +
                            (char)*(long *)(_configure_file + -0x18) + -8);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&configure_file,(string *)&temp_string,cVar4);
    if ((*temp_string._M_dataplus._M_p != '#') || (temp_string._M_dataplus._M_p[1] != '#')) {
      iVar5 = std::__cxx11::string::find((char *)&temp_string,0x1097ef,0);
      iVar6 = std::__cxx11::string::find((char *)&temp_string,0x109802,0);
      iVar7 = std::__cxx11::string::find((char *)&temp_string,0x109813,0);
      iVar8 = std::__cxx11::string::find((char *)&temp_string,0x109827,0);
      local_838 = (double)std::__cxx11::string::find((char *)&temp_string,0x109833,0);
      iVar9 = std::__cxx11::string::find((char *)&temp_string,0x10983b,0);
      iVar10 = std::__cxx11::string::find((char *)&temp_string,0x109841,0);
      local_7d8 = (double)std::__cxx11::string::find((char *)&temp_string,0x10984f,0);
      iVar11 = std::__cxx11::string::find((char *)&temp_string,0x10985b,0);
      iVar12 = std::__cxx11::string::find((char *)&temp_string,0x10986d,0);
      local_848 = (double)std::__cxx11::string::find((char *)&temp_string,0x109883,0);
      uVar16 = 0;
      uVar13 = std::__cxx11::string::find((char *)&temp_string,0x10989b,0);
      if (-1 < (int)uVar13) {
        local_7e8 = (double)CONCAT71((int7)((ulong)uVar13 >> 8),1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"make_layer_video=yes\n",0x15);
      }
      if (-1 < iVar5) {
        _ss = local_7b0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"camera_location=v(","");
        VectorArgumentExtracterStream(&temp_string,iVar5 + local_7b8,&local_5b8);
        if (_ss != local_7b0) {
          operator_delete(_ss,local_7b0[0] + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"camera_location=",0x10);
        poVar14 = operator<<((ostream *)&std::cout,&local_5b8);
        uVar15 = (undefined7)((ulong)poVar14 >> 8);
        bVar27 = 1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      }
      if (-1 < iVar6) {
        _ss = local_7b0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"camera_lookat=v(","");
        VectorArgumentExtracterStream(&temp_string,iVar6 + local_7b8,&local_5d8);
        if (_ss != local_7b0) {
          operator_delete(_ss,local_7b0[0] + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"camera_lookat=",0xe);
        poVar14 = operator<<((ostream *)&std::cout,&local_5d8);
        local_870 = CONCAT71((int7)((ulong)poVar14 >> 8),1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      }
      if (-1 < iVar7) {
        _ss = local_7b0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"filament_color=rgb(","");
        VectorArgumentExtracterStream(&temp_string,iVar7 + local_7b8,&local_5f8);
        if (_ss != local_7b0) {
          operator_delete(_ss,local_7b0[0] + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"filament_color=",0xf);
        operator<<((ostream *)&std::cout,&local_5f8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      }
      if (-1 < iVar12) {
        _ss = local_7b0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"cutting_plane_normal=v(","");
        VectorArgumentExtracterStream(&temp_string,iVar12 + local_7b8,&local_618);
        if (_ss != local_7b0) {
          operator_delete(_ss,local_7b0[0] + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"cutting_plane_normal=",0x15);
        poVar14 = operator<<((ostream *)&std::cout,&local_618);
        uStack_8f7 = (undefined7)((ulong)poVar14 >> 8);
        local_8f8 = 1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      }
      if (-1 < iVar8) {
        _ss = local_7b0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"view_angle=","");
        ValueArgumentExtracterStream(&temp_string,iVar8 + local_7b8,&camera_angle);
        if (_ss != local_7b0) {
          operator_delete(_ss,local_7b0[0] + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"view_angle=",0xb);
        local_858 = camera_angle;
        poVar14 = std::ostream::_M_insert<double>(camera_angle);
        uVar17 = (undefined7)((ulong)uVar16 >> 8);
        uVar16 = CONCAT71(uVar17,1);
        bVar26 = 1;
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
      }
      if (-1 < local_838._0_4_) {
        _ss = local_7b0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"nozzle_diameter=","");
        ValueArgumentExtracterStream(&temp_string,SUB84(local_838,0) + local_7b8,&nozzle_width);
        if (_ss != local_7b0) {
          operator_delete(_ss,local_7b0[0] + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"nozzle_diameter=",0x10);
        local_860 = nozzle_width;
        poVar14 = std::ostream::_M_insert<double>(nozzle_width);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
      }
      if (-1 < iVar10) {
        _ss = local_7b0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"transparency=","");
        ValueArgumentExtracterStream(&temp_string,iVar10 + local_7b8,&transparency);
        if (_ss != local_7b0) {
          operator_delete(_ss,local_7b0[0] + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"transparency=",0xd);
        local_868 = transparency;
        poVar14 = std::ostream::_M_insert<double>(transparency);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
      }
      iVar5 = SUB84(local_7d8,0);
      if (-1 < iVar5) {
        _ss = local_7b0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"layer_only=","");
        ValueArgumentExtracterStream(&temp_string,iVar5 + local_7b8,&layer_only);
        if (_ss != local_7b0) {
          operator_delete(_ss,local_7b0[0] + 1);
        }
        massive_center_01 = (vector3 *)layer_only;
        if (0.0 <= layer_only) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"layer_only=",0xb);
          poVar14 = std::ostream::_M_insert<double>((double)massive_center_01);
          uVar18 = (undefined7)((ulong)uVar16 >> 8);
          uVar16 = CONCAT71(uVar18,1);
          bVar28 = 1;
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
        }
      }
      if (-1 < iVar11) {
        _ss = local_7b0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"layer_before_and=","");
        ValueArgumentExtracterStream(&temp_string,iVar11 + local_7b8,&layer_before_and);
        if (_ss != local_7b0) {
          operator_delete(_ss,local_7b0[0] + 1);
        }
        layer_before_and_00 = layer_before_and;
        if (0.0 <= layer_before_and) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"layer_before_and=",0x11);
          poVar14 = std::ostream::_M_insert<double>(layer_before_and_00);
          uVar19 = (undefined7)((ulong)uVar16 >> 8);
          bVar29 = 1;
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
        }
      }
      if (-1 < local_848._0_4_) {
        _ss = local_7b0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"cutting_plane_distance=","");
        ValueArgumentExtracterStream
                  (&temp_string,SUB84(local_848,0) + local_7b8,&cutting_plane_distance);
        if (_ss != local_7b0) {
          operator_delete(_ss,local_7b0[0] + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"cutting_plane_distance=",0x17);
        local_850 = cutting_plane_distance;
        poVar14 = std::ostream::_M_insert<double>(cutting_plane_distance);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
      }
      if (-1 < iVar9) {
        local_8b8 = local_8a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_8b8,"file=","");
        local_898.x = (double)&local_898.z;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_898,"file=","");
        std::__cxx11::string::substr((ulong)&ss,(ulong)&temp_string);
        std::__cxx11::string::operator=((string *)&in_file_name,(string *)&ss);
        if (_ss != local_7b0) {
          operator_delete(_ss,local_7b0[0] + 1);
        }
        if ((double *)local_898.x != &local_898.z) {
          operator_delete((void *)local_898.x,(long)local_898.z + 1);
        }
        if (local_8b8 != local_8a8) {
          operator_delete(local_8b8,local_8a8[0] + 1);
        }
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)&ss,(string *)&in_file_name,_S_in);
        std::operator>>((istream *)&ss,(string *)&in_file_name);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"file=",5);
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,in_file_name._M_dataplus._M_p,
                             in_file_name._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
        std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
        std::ios_base::~ios_base(local_748);
        uVar21 = 1;
      }
    }
  }
  if ((local_8f8 & 1) != 0) {
    local_578._8_8_ = local_618.y;
    local_578._0_8_ = local_618.x;
    local_588._8_4_ = SUB84(local_618.y,0);
    local_588._0_8_ = local_618.y;
    local_588._12_4_ = (int)((ulong)local_618.y >> 0x20);
    in_XMM1_Qa = local_618.x * local_618.x + local_618.y * local_618.y;
    dVar2 = SQRT(local_618.z * local_618.z + in_XMM1_Qa);
    local_820 = local_618.z;
    in_XMM3_Qa = local_618.z / dVar2;
    auVar1._8_4_ = SUB84(dVar2,0);
    auVar1._0_8_ = dVar2;
    auVar1._12_4_ = (int)((ulong)dVar2 >> 0x20);
    in_XMM2 = divpd(local_578,auVar1);
    local_828 = in_XMM3_Qa;
    local_598 = in_XMM2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)temp_string._M_dataplus._M_p != &temp_string.field_2) {
    operator_delete(temp_string._M_dataplus._M_p,
                    CONCAT71(temp_string.field_2._M_allocated_capacity._1_7_,
                             temp_string.field_2._M_local_buf[0]) + 1);
  }
  dVar2 = local_5b8.z;
  local_898.x = 0.0;
  local_898.y = 0.0;
  local_898.z = 0.0;
  layer_count = 0;
  local_838 = local_5b8.x;
  dStack_830 = local_5b8.y;
  local_908 = SUB84(local_5b8.z,0);
  uStack_904 = (undefined4)((ulong)local_5b8.z >> 0x20);
  local_848 = local_5d8.x;
  dStack_840 = local_5d8.y;
  uVar30 = SUB84(local_5d8.z,0);
  uStack_90c = (undefined4)((ulong)local_5d8.z >> 0x20);
  local_7d8 = local_5f8.x;
  dStack_7d0 = local_5f8.y;
  uVar24 = 0x41;
  uVar25 = 0x1074;
  psVar22 = (string *)local_548;
  dVar31 = local_5f8.z;
  local_548[0] = local_538;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_548,in_file_name._M_dataplus._M_p,
             in_file_name._M_dataplus._M_p + in_file_name._M_string_length);
  uVar21 = uVar21 & 1;
  look_at.z = 0.0;
  look_at.x = 0.0;
  look_at.y = 0.0;
  auVar3[8] = (char)&layer_count;
  auVar3._0_8_ = &local_898;
  auVar3._9_7_ = (int7)((ulong)&layer_count >> 8);
  auVar3._16_8_ = 0;
  cutting_plane_normal_01.x._1_7_ = uVar25;
  cutting_plane_normal_01.x._0_1_ = uVar24;
  cutting_plane_normal_01.y._0_1_ = bVar26;
  cutting_plane_normal_01.y._1_7_ = uVar17;
  cutting_plane_normal_01.z._0_1_ = bVar27;
  cutting_plane_normal_01.z._1_7_ = uVar15;
  cutting_plane.normal.x._1_7_ = uVar18;
  cutting_plane.normal.x._0_1_ = bVar28;
  cutting_plane.normal.y._0_1_ = bVar29;
  cutting_plane.normal.y._1_7_ = uVar19;
  cutting_plane.normal.z._0_4_ = uVar21;
  cutting_plane.normal.z._4_4_ = 0;
  cutting_plane.start_distance._0_4_ = uVar30;
  cutting_plane.start_distance._4_4_ = uStack_90c;
  cutting_plane.uniform_normal.x._0_4_ = local_908;
  cutting_plane.uniform_normal.x._4_4_ = uStack_904;
  cutting_plane.uniform_normal.y._0_4_ = local_900;
  cutting_plane.uniform_normal.y._4_4_ = layer_count;
  cutting_plane.uniform_normal.z._0_1_ = local_8f8;
  cutting_plane.uniform_normal.z._1_7_ = uStack_8f7;
  GetMassiveCenter((vector3)ZEXT1224(CONCAT48(uVar21,(string *)local_548)),look_at,
                   (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da),in_XMM1_Qa,SUB81(psVar22,0),
                   (vector3)(auVar3 << 0x40),cutting_plane_normal_01,cutting_plane,in_XMM2._0_8_,
                   in_XMM3_Qa,in_XMM4_Qa,in_XMM5_Qa,(string *)(ulong)uVar21,false,false,
                   SUB81(in_R8,0),(bool)uVar23,SUB81(dVar31,0),SUB81(layer_before_and_00,0),
                   massive_center_01,(int *)in_file_name._M_dataplus._M_p);
  if (local_548[0] != local_538) {
    operator_delete(local_548[0],local_538[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Layer count: ",0xd);
  iVar5 = layer_count;
  poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,layer_count);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Gcode Massive center: ",0x16);
  operator<<((ostream *)&std::cout,&local_898);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Move the hole print to the original point.\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Writing POV-Ray file...\n",0x18);
  cutting_plane_distance_00 = in_XMM2._0_8_;
  if (((ulong)local_7e8 & 1) == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::__cxx11::string::find((char *)&in_file_name,0x109985,0);
    std::__cxx11::string::substr((ulong)&temp_string,(ulong)&in_file_name);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_7b0,temp_string._M_dataplus._M_p,temp_string._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)temp_string._M_dataplus._M_p != &temp_string.field_2) {
      operator_delete(temp_string._M_dataplus._M_p,
                      CONCAT71(temp_string.field_2._M_allocated_capacity._1_7_,
                               temp_string.field_2._M_local_buf[0]) + 1);
    }
    local_4e8.x = local_838;
    local_4e8.y = dStack_830;
    local_4e8.z = dVar2;
    local_508.x = local_848;
    local_508.y = dStack_840;
    local_508.z = (double)CONCAT44(uStack_90c,uVar30);
    local_528.x = local_7d8;
    local_528.y = dStack_7d0;
    local_450 = local_578._0_8_;
    local_448 = local_588._0_8_;
    local_440 = local_820;
    local_438 = local_850;
    local_430 = local_598._0_8_;
    uStack_428 = local_598._8_8_;
    local_420 = local_828;
    uVar23 = 0x2c;
    local_568[0] = local_558;
    local_528.z = dVar31;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_568,in_file_name._M_dataplus._M_p,
               in_file_name._M_dataplus._M_p + in_file_name._M_string_length);
    local_258 = local_898.x;
    dStack_250 = local_898.y;
    local_248 = local_898.z;
    cutting_plane_normal_00.y._0_4_ = uVar21;
    cutting_plane_normal_00.x = (double)local_568;
    cutting_plane_normal_00.y._4_4_ = 0;
    cutting_plane_normal_00.z._0_4_ = (byte)local_870 & 1;
    cutting_plane_normal_00.z._4_4_ = 0;
    in_file_name_01._M_string_length._0_4_ = bVar27 & 1;
    in_file_name_01._M_dataplus._M_p = (pointer)(ulong)(bVar26 & 1);
    in_file_name_01._M_string_length._4_4_ = 0;
    in_file_name_01.field_2._M_allocated_capacity._0_4_ = bVar28 & 1;
    in_file_name_01.field_2._M_allocated_capacity._4_4_ = 0;
    in_file_name_01.field_2._8_4_ = bVar29 & 1;
    in_file_name_01.field_2._12_4_ = 0;
    massive_center_00.x._1_7_ = uVar17;
    massive_center_00.x._0_1_ = bVar26;
    massive_center_00.y._0_1_ = bVar27;
    massive_center_00.y._1_7_ = uVar15;
    massive_center_00.z._0_1_ = bVar28;
    massive_center_00.z._1_7_ = uVar18;
    Generate_single_file
              (&local_4e8,&local_508,local_858,local_860,(bool)(local_8f8 & 1),&local_528,
               cutting_plane_normal_00,(CuttingPlane *)(ulong)(bVar29 & 1),cutting_plane_distance_00
               ,local_868,(double)massive_center_01,layer_before_and_00,in_file_name_01,
               SUB81(&local_450,0),SUB81(&local_258,0),SUB81((stringstream *)&ss,0),false,false,
               (bool)uVar23,massive_center_00,(stringstream *)CONCAT71(uVar19,bVar29),uVar21,
               SUB41(uVar30,0));
    if (local_568[0] != local_558) {
      operator_delete(local_568[0],local_558[0] + 1);
    }
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::__cxx11::string::find((char *)&in_file_name,0x109985,0);
    std::__cxx11::string::substr((ulong)&temp_string,(ulong)&in_file_name);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_7b0,temp_string._M_dataplus._M_p,temp_string._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)temp_string._M_dataplus._M_p != &temp_string.field_2) {
      operator_delete(temp_string._M_dataplus._M_p,
                      CONCAT71(temp_string.field_2._M_allocated_capacity._1_7_,
                               temp_string.field_2._M_local_buf[0]) + 1);
    }
    if (0 < iVar5) {
      local_7e8 = local_898.x;
      dStack_7e0 = local_898.y;
      local_5a0 = local_898.z;
      iVar6 = 0;
      bVar29 = bVar29 & 1;
      uVar19 = 0;
      bVar28 = bVar28 & 1;
      uVar18 = 0;
      bVar27 = bVar27 & 1;
      uVar17 = 0;
      bVar26 = bVar26 & 1;
      uVar15 = 0;
      uVar20 = (uint)(byte)local_870;
      has_cutting_plane = (bool)(local_8f8 & 1);
      do {
        std::__cxx11::stringstream::stringstream((stringstream *)&temp_string);
        std::__cxx11::string::find((char *)&in_file_name,0x109985,0);
        std::__cxx11::string::substr((ulong)&local_8b8,(ulong)&in_file_name);
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)temp_string.field_2._M_local_buf,(char *)local_8b8,local_8b0
                            );
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\\",1);
        if (local_8b8 != local_8a8) {
          operator_delete(local_8b8,local_8a8[0] + 1);
        }
        local_468.x = local_838;
        local_468.y = dStack_830;
        local_468.z = dVar2;
        local_488.x = local_848;
        local_488.y = dStack_840;
        local_488.z = (double)CONCAT44(uStack_90c,uVar30);
        local_4a8.x = local_7d8;
        local_4a8.y = dStack_7d0;
        local_418 = local_578._0_8_;
        local_410 = local_588._0_8_;
        local_408 = local_820;
        local_400 = local_850;
        local_3f8 = local_598._0_8_;
        uStack_3f0 = local_598._8_8_;
        local_3e8 = local_828;
        local_638[0] = local_628;
        uVar23 = 0xcc;
        local_4a8.z = dVar31;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_638,in_file_name._M_dataplus._M_p,
                   in_file_name._M_dataplus._M_p + in_file_name._M_string_length);
        local_4c8 = local_7e8;
        dStack_4c0 = dStack_7e0;
        local_4b8 = local_5a0;
        in_file_name_00.field_2._9_7_ = uVar19;
        in_file_name_00.field_2._M_local_buf[8] = bVar29;
        in_file_name_00.field_2._M_allocated_capacity._1_7_ = uVar18;
        in_file_name_00.field_2._M_local_buf[0] = bVar28;
        in_file_name_00._M_string_length._1_7_ = uVar17;
        in_file_name_00._M_string_length._0_1_ = bVar27;
        in_file_name_00._M_dataplus._M_p._1_7_ = uVar15;
        in_file_name_00._M_dataplus._M_p._0_1_ = bVar26;
        cutting_plane_normal.y._0_4_ = uVar21;
        cutting_plane_normal.x = (double)local_638;
        cutting_plane_normal.y._4_4_ = 0;
        cutting_plane_normal.z._0_4_ = uVar20 & 1;
        cutting_plane_normal.z._4_4_ = 0;
        massive_center.x._1_7_ = uVar15;
        massive_center.x._0_1_ = bVar26;
        massive_center.y._0_1_ = bVar27;
        massive_center.y._1_7_ = uVar17;
        massive_center.z._0_1_ = bVar28;
        massive_center.z._1_7_ = uVar18;
        Generate_single_file
                  (&local_468,&local_488,local_858,local_860,has_cutting_plane,&local_4a8,
                   cutting_plane_normal,in_R8,in_XMM2._0_8_,local_868,(double)massive_center_01,
                   layer_before_and_00,in_file_name_00,SUB81(&local_418,0),SUB81(&local_4c8,0),
                   SUB81(&temp_string,0),SUB41(iVar6,0),true,(bool)uVar23,massive_center,
                   (stringstream *)CONCAT71(uVar19,bVar29),uVar21,SUB41(uVar30,0));
        if (local_638[0] != local_628) {
          operator_delete(local_638[0],local_628[0] + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&temp_string);
        std::ios_base::~ios_base(local_360);
        iVar6 = iVar6 + 1;
      } while (iVar5 != iVar6);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::ios_base::~ios_base(local_740);
  std::fstream::~fstream(&configure_file);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_file_name._M_dataplus._M_p != &in_file_name.field_2) {
    operator_delete(in_file_name._M_dataplus._M_p,
                    CONCAT71(in_file_name.field_2._M_allocated_capacity._1_7_,
                             in_file_name.field_2._M_local_buf[0]) + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
  vector3 camera_position_vector(-100, -250, 220);
  vector3 look_at(-100, 100, 30);
  double camera_angle = 60;
  double nozzle_width = 0.4;
  bool has_cutting_plane = false;
  vector3 filament_color = vector3(0.3, 0.8, 1.0) * 0.59;
  vector3 cutting_plane_normal = vector3(0.3, 0.8, 1.0) * 0.59;
  CuttingPlane cutting_plane;
  double cutting_plane_distance = 0.0;
  double transparency = 0.0;
  double layer_only = -1;
  double layer_before_and = -1;
  string in_file_name;
  bool in_file_name_specified = false;
  bool look_at_specified = false;
  bool angle_specified = false;
  bool camera_position_specified = false;
  bool layer_only_specified = false;
  bool layer_before_and_specified = false;
  bool make_layer_video = false;

  // Read configurations file.
  cout << "Reading configurations file...\n";
  fstream configure_file;
  configure_file.open("configurations.txt");
  if (!configure_file)
  {
    cout << "Configurations file not found.\n" << "Exit.\n";
    exit(0);
  }
  else
  {
    string temp_string;
    cout << "Parameters derived:\n";

    while (!configure_file.eof())
    {
      getline(configure_file, temp_string);

      if (temp_string[0] == '#' && temp_string[1] == '#')
        continue;

      int camera_location_conf_pos = temp_string.find("camera_location=v(");
      int camera_lookat_conf_pos = temp_string.find("camera_lookat=v(");
      int filament_color_conf_pos = temp_string.find("filament_color=rgb(");
      int view_angle_conf_pos = temp_string.find("view_angle=");
      int nozzle_conf_pos = temp_string.find("nozzle=");
      int file_conf_pos = temp_string.find("file=");
      int transparency_conf_pos = temp_string.find("transparency=");
      int layer_only_pos = temp_string.find("layer_only=");
      int layer_before_and_pos = temp_string.find("layer_before_and=");
      int cutting_plane_normal_pos = temp_string.find("cutting_plane_normal=");
      int cutting_plane_distance_pos = temp_string.find("cutting_plane_distance=");
      int make_layer_video_pos = temp_string.find("make_layer_video");

      //////////////////////////////////////////////////////////////////////////
      // Boolean arguments.
      if (make_layer_video_pos >= 0)
      {
        make_layer_video = true;
        cout << "make_layer_video=yes\n";
      }

      //////////////////////////////////////////////////////////////////////////
      // Vector arguments.
      if (camera_location_conf_pos >= 0)
      {
        VectorArgumentExtracterStream(temp_string, camera_location_conf_pos + string("camera_location=v(").length(), camera_position_vector);
        camera_position_specified = true;
        cout << "camera_location=" << camera_position_vector << "\n";
      }

      if (camera_lookat_conf_pos >= 0)
      {
        VectorArgumentExtracterStream(temp_string, camera_lookat_conf_pos + string("camera_lookat=v(").length(), look_at);
        look_at_specified = true;
        cout << "camera_lookat=" << look_at << "\n";
      }

      if (filament_color_conf_pos >= 0)
      {
        VectorArgumentExtracterStream(temp_string, filament_color_conf_pos + string("filament_color=rgb(").length(), filament_color);
        cout << "filament_color=" << filament_color << "\n";
      }

      if (cutting_plane_normal_pos >= 0)
      {
        VectorArgumentExtracterStream(temp_string, cutting_plane_normal_pos + string("cutting_plane_normal=v(").length(), cutting_plane_normal);
        has_cutting_plane = true;
        cout << "cutting_plane_normal=" << cutting_plane_normal << "\n";
      }

      //////////////////////////////////////////////////////////////////////////
      // Value arguments.
      if (view_angle_conf_pos >= 0)
      {
        ValueArgumentExtracterStream(temp_string, view_angle_conf_pos + string("view_angle=").length(), camera_angle);
        angle_specified = true;
        cout << "view_angle=" << camera_angle << "\n";
      }

      if (nozzle_conf_pos >= 0)
      {
        ValueArgumentExtracterStream(temp_string, nozzle_conf_pos + string("nozzle_diameter=").length(), nozzle_width);
        cout << "nozzle_diameter=" << nozzle_width << "\n";
      }

      if (transparency_conf_pos >= 0)
      {
        ValueArgumentExtracterStream(temp_string, transparency_conf_pos + string("transparency=").length(), transparency);
        cout << "transparency=" << transparency << "\n";
      }

      if (layer_only_pos >= 0)
      {
        ValueArgumentExtracterStream(temp_string, layer_only_pos + string("layer_only=").length(), layer_only);
        if (layer_only >= 0)
        {
          layer_only_specified = true;
          cout << "layer_only=" << layer_only << "\n";
        }
      }

      if (layer_before_and_pos >= 0)
      {
        ValueArgumentExtracterStream(temp_string, layer_before_and_pos + string("layer_before_and=").length(), layer_before_and);
        if (layer_before_and >= 0)
        {
          layer_before_and_specified = true;
          cout << "layer_before_and=" << layer_before_and << "\n";
        }
      }

      if (cutting_plane_distance_pos >= 0)
      {
        ValueArgumentExtracterStream(temp_string, cutting_plane_distance_pos + string("cutting_plane_distance=").length(), cutting_plane_distance);
        cout << "cutting_plane_distance=" << cutting_plane_distance << "\n";
      }

      //////////////////////////////////////////////////////////////////////////
      // String arguments.
      if (file_conf_pos >= 0)
      {
        in_file_name = temp_string.substr(file_conf_pos + string("file=").length(), temp_string.size() - file_conf_pos - string("file=").length());
        in_file_name_specified = true;
        istringstream ss(in_file_name);
        ss >> in_file_name;
        cout << "file=" << in_file_name << "\n";
      }
    }

    if (has_cutting_plane)
    {
      cutting_plane = CuttingPlane(cutting_plane_normal, cutting_plane_distance);
    }
  }

  // Compute the massive center.
  vector3 massive_center(0, 0, 0);
  int layer_count = 0;
  GetMassiveCenter(camera_position_vector, look_at, camera_angle, nozzle_width, has_cutting_plane,
    filament_color, cutting_plane_normal, cutting_plane, cutting_plane_distance,
    transparency, layer_only, layer_before_and, in_file_name, in_file_name_specified,
    look_at_specified, angle_specified, camera_position_specified, layer_only_specified, layer_before_and_specified,
    massive_center, layer_count);

  cout << "Layer count: " <<layer_count << "\n";
  cout << "Gcode Massive center: " << massive_center << "\n";
  cout << "Move the hole print to the original point.\n";

  // Write to the POV-Ray file.
  cout << "Writing POV-Ray file...\n";
  if (make_layer_video)
  {
    stringstream temp;
    temp << in_file_name.substr(0, in_file_name.find(".gcode"));
    // _mkdir(temp.str().c_str());

    for (int layer_index = 0; layer_index < layer_count; layer_index++)
    {
      stringstream out_file_name;
      out_file_name << in_file_name.substr(0, in_file_name.find(".gcode")) << "\\";

      Generate_single_file(camera_position_vector, look_at, camera_angle, nozzle_width, has_cutting_plane,
        filament_color, cutting_plane_normal, cutting_plane, cutting_plane_distance,
        transparency, layer_only, layer_before_and, in_file_name, in_file_name_specified,
        look_at_specified, angle_specified, camera_position_specified, layer_only_specified, layer_before_and_specified,
        massive_center, out_file_name, layer_index, make_layer_video);
    }
  }
  else
  {
    stringstream out_file_name;
    out_file_name << in_file_name.substr(0, in_file_name.find(".gcode"));
#ifdef _WIN32
    SYSTEMTIME sys;
    GetLocalTime(&sys);
    out_file_name << '_' << sys.wMonth << '_' << sys.wDay << '_' << sys.wHour << '_' << sys.wMinute;
#endif

    Generate_single_file(camera_position_vector, look_at, camera_angle, nozzle_width, has_cutting_plane,
      filament_color, cutting_plane_normal, cutting_plane, cutting_plane_distance,
      transparency, layer_only, layer_before_and, in_file_name, in_file_name_specified,
      look_at_specified, angle_specified, camera_position_specified, layer_only_specified, layer_before_and_specified,
      massive_center, out_file_name, 0, make_layer_video);
  }

  return 0;
}